

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

void __thiscall
ScriptTest::DoTest(ScriptTest *this,CScript *scriptPubKey,CScript *scriptSig,
                  CScriptWitness *scriptWitness,uint32_t flags,string *message,int scriptError,
                  CAmount nValue)

{
  bool bVar1;
  uint uVar2;
  uint64_t uVar3;
  CTransaction *in_RCX;
  CMutableTransaction *in_RDX;
  CMutableTransaction *in_RSI;
  ScriptError *in_RDI;
  uint in_R8D;
  GenericTransactionSignatureChecker<CMutableTransaction> *in_R9;
  long in_FS_OFFSET;
  byte bVar4;
  int in_stack_00000008;
  uint32_t extra_flags;
  int i;
  bool expect;
  uint32_t combined_flags;
  CMutableTransaction tx2;
  CMutableTransaction tx;
  ScriptError err;
  CTransaction txCredit;
  CTransaction *in_stack_fffffffffffffb38;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  undefined4 in_stack_fffffffffffffb48;
  uint in_stack_fffffffffffffb4c;
  CMutableTransaction *in_stack_fffffffffffffb50;
  GenericTransactionSignatureChecker<CMutableTransaction> *in_stack_fffffffffffffb58;
  undefined7 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb67;
  CMutableTransaction *in_stack_fffffffffffffb68;
  CMutableTransaction *in_stack_fffffffffffffb70;
  CTransaction *in_stack_fffffffffffffb78;
  undefined8 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  CScriptWitness *in_stack_fffffffffffffb98;
  CScript *in_stack_fffffffffffffba0;
  CMutableTransaction *pCVar5;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  int local_410;
  uint in_stack_fffffffffffffbf4;
  CScriptWitness *in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc00;
  uint local_3ec;
  const_string local_3c8;
  assertion_result local_370 [2];
  uint local_334;
  lazy_ostream local_320 [2];
  assertion_result local_300 [2];
  const_string local_2c8;
  lazy_ostream local_2b8 [4];
  assertion_result local_270 [25];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = in_stack_00000008 == 0;
  local_3ec = in_R8D;
  if ((in_R8D & 0x100) != 0) {
    local_3ec = in_R8D | 0x801;
  }
  BuildCreditingTransaction
            ((CScript *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
             (int)((ulong)in_stack_fffffffffffffb88 >> 0x20));
  CTransaction::CTransaction(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffb38);
  BuildSpendingTransaction
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (CTransaction *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  CMutableTransaction::CMutableTransaction
            (in_stack_fffffffffffffb68,
             (CMutableTransaction *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               (pointer)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
               (unsigned_long)in_stack_fffffffffffffb38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffb78,
               (const_string *)in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
               (const_string *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
    pCVar5 = in_RSI;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
               (CAmount *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
               (MissingDataBehavior)((ulong)in_stack_fffffffffffffb38 >> 0x20));
    VerifyScript((CScript *)in_R9,(CScript *)CONCAT17(bVar4,in_stack_fffffffffffffc00),
                 in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4,
                 (BaseSignatureChecker *)
                 CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),in_RDI);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               (bool)in_stack_fffffffffffffb47);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               (pointer)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
               (unsigned_long)in_stack_fffffffffffffb38);
    in_stack_fffffffffffffb38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_270,local_2b8,&local_2c8,0x7f,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffb38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb38);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_fffffffffffffb38)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               (pointer)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
               (unsigned_long)in_stack_fffffffffffffb38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffb78,
               (const_string *)in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
               (const_string *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               (bool)in_stack_fffffffffffffb47);
    boost::unit_test::lazy_ostream::instance();
    FormatScriptError_abi_cxx11_((ScriptError_t)((ulong)pCVar5 >> 0x20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb50,
                   (char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    FormatScriptError_abi_cxx11_((ScriptError_t)((ulong)pCVar5 >> 0x20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb50,
                   (char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               (pointer)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
               (unsigned_long)in_stack_fffffffffffffb38);
    in_stack_fffffffffffffb38 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_300,local_320,(const_string *)&stack0xfffffffffffffcd0,0x80,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffb38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb38);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (local_410 = 0; local_410 < 0x10; local_410 = local_410 + 1) {
    uVar3 = RandomMixin<FastRandomContext>::randbits
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffb58,
                       (int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    uVar2 = (uint)uVar3;
    if ((bVar4 & 1) == 0) {
      local_334 = local_3ec | uVar2;
    }
    else {
      local_334 = local_3ec & (uVar2 ^ 0xffffffff);
    }
    if ((((local_334 & 0x100) == 0) || (((local_334 ^ 0xffffffff) & 0x801) == 0)) &&
       (((local_334 & 0x800) == 0 || (((local_334 ^ 0xffffffff) & 1) == 0)))) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                   (pointer)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                   (unsigned_long)in_stack_fffffffffffffb38);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffb38);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffb78,
                   (const_string *)in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                   (const_string *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
        in_stack_fffffffffffffb68 = in_RDX;
        in_stack_fffffffffffffb70 = in_RSI;
        in_stack_fffffffffffffb78 = in_RCX;
        std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                   CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                   CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40));
        GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
                  (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                   (CAmount *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                   (MissingDataBehavior)((ulong)in_stack_fffffffffffffb38 >> 0x20));
        in_stack_fffffffffffffb67 =
             VerifyScript((CScript *)in_R9,(CScript *)CONCAT17(bVar4,in_stack_fffffffffffffc00),
                          in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4,
                          (BaseSignatureChecker *)CONCAT44(uVar2,in_stack_fffffffffffffbe8),in_RDI);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)
                   ,(bool)in_stack_fffffffffffffb47);
        in_stack_fffffffffffffb58 = in_R9;
        in_stack_fffffffffffffb50 =
             (CMutableTransaction *)boost::unit_test::lazy_ostream::instance();
        in_R9 = in_stack_fffffffffffffb58;
        tinyformat::format<unsigned_int>
                  ((char *)in_stack_fffffffffffffb68,
                   (uint *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb38);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                   (pointer)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                   (unsigned_long)in_stack_fffffffffffffb38);
        in_stack_fffffffffffffb38 = (CTransaction *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_370,(lazy_ostream *)&stack0xfffffffffffffc48,&local_3c8,0x89,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffffb38);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb38);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb38);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffb38);
        GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
                  ((GenericTransactionSignatureChecker<CMutableTransaction> *)
                   in_stack_fffffffffffffb38);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
  }
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffb38);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffb38);
  CTransaction::~CTransaction(in_stack_fffffffffffffb38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DoTest(const CScript& scriptPubKey, const CScript& scriptSig, const CScriptWitness& scriptWitness, uint32_t flags, const std::string& message, int scriptError, CAmount nValue = 0)
{
    bool expect = (scriptError == SCRIPT_ERR_OK);
    if (flags & SCRIPT_VERIFY_CLEANSTACK) {
        flags |= SCRIPT_VERIFY_P2SH;
        flags |= SCRIPT_VERIFY_WITNESS;
    }
    ScriptError err;
    const CTransaction txCredit{BuildCreditingTransaction(scriptPubKey, nValue)};
    CMutableTransaction tx = BuildSpendingTransaction(scriptSig, scriptWitness, txCredit);
    CMutableTransaction tx2 = tx;
    BOOST_CHECK_MESSAGE(VerifyScript(scriptSig, scriptPubKey, &scriptWitness, flags, MutableTransactionSignatureChecker(&tx, 0, txCredit.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err) == expect, message);
    BOOST_CHECK_MESSAGE(err == scriptError, FormatScriptError(err) + " where " + FormatScriptError((ScriptError_t)scriptError) + " expected: " + message);

    // Verify that removing flags from a passing test or adding flags to a failing test does not change the result.
    for (int i = 0; i < 16; ++i) {
        uint32_t extra_flags(m_rng.randbits(16));
        uint32_t combined_flags{expect ? (flags & ~extra_flags) : (flags | extra_flags)};
        // Weed out some invalid flag combinations.
        if (combined_flags & SCRIPT_VERIFY_CLEANSTACK && ~combined_flags & (SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS)) continue;
        if (combined_flags & SCRIPT_VERIFY_WITNESS && ~combined_flags & SCRIPT_VERIFY_P2SH) continue;
        BOOST_CHECK_MESSAGE(VerifyScript(scriptSig, scriptPubKey, &scriptWitness, combined_flags, MutableTransactionSignatureChecker(&tx, 0, txCredit.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err) == expect, message + strprintf(" (with flags %x)", combined_flags));
    }
}